

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf.cpp
# Opt level: O2

void bal::__statistics_print(void)

{
  ostream *poVar1;
  
  std::chrono::_V2::system_clock::now();
  poVar1 = std::operator<<((ostream *)&std::cout,"Statistics: append: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", find: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"/");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", compare: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," ms");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void __statistics_print() {
        auto duration = std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::system_clock::now() - __time_start_);
        std::cout << "Statistics: append: " << __append_clause_ << ", find: " << __find_clause_found << "/" << __find_clause_unfound << ", compare: " << __compare_clauses_ << ", " << duration.count() << " ms" << std::endl;
    }